

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall adios2::core::IO::RemoveEngine(IO *this,string *name)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
               ::find(&(this->m_Engines)._M_t,name);
  if ((_Rb_tree_header *)__position._M_node != &(this->m_Engines)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
                        *)&this->m_Engines,__position);
    return;
  }
  return;
}

Assistant:

void IO::RemoveEngine(const std::string &name)
{
    auto itEngine = m_Engines.find(name);
    if (itEngine != m_Engines.end())
    {
        m_Engines.erase(itEngine);
    }
}